

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O2

void __thiscall
Assimp::Blender::Structure::_defaultInitializer<0>::operator()
          (_defaultInitializer<0> *this,ListBase *out,char *param_2)

{
  ListBase local_38;
  
  local_38.super_ElemBase.dna_type = (char *)0x0;
  local_38.super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ListBase_0071fe28;
  local_38.first.super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38.first.super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38.last.super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38.last.super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ListBase::operator=(out,&local_38);
  ListBase::~ListBase(&local_38);
  return;
}

Assistant:

void operator ()(T& out, const char* = NULL) {
            out = T();
        }